

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvhz.cpp
# Opt level: O1

void UConverter_fromUnicode_HZ_OFFSETS_LOGIC(UConverterFromUnicodeArgs *args,UErrorCode *err)

{
  UConverter *pUVar1;
  char cVar2;
  UErrorCode UVar3;
  int32_t iVar4;
  uint uVar5;
  long lVar6;
  uint8_t uVar7;
  uint8_t uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  int32_t *piVar14;
  char cVar15;
  uint32_t local_74;
  ulong local_70;
  uint local_64;
  char *local_60;
  UErrorCode *local_58;
  long *local_50;
  ulong local_48;
  ulong local_40;
  UChar *local_38;
  
  local_38 = args->source;
  local_60 = args->target;
  piVar14 = args->offsets;
  iVar10 = *(int *)&args->targetLimit - (int)local_60;
  local_48 = (ulong)((long)args->sourceLimit - (long)local_38) >> 1;
  local_50 = (long *)args->converter->extraInfo;
  cVar15 = *(char *)((long)local_50 + 0x12);
  local_58 = err;
  cVar2 = cVar15;
  if ((args->converter->fromUChar32 == 0) || (local_64 = 0, iVar10 < 1)) {
    if ((int)(uint)local_48 < 1) {
      iVar11 = 0;
      iVar9 = 0;
    }
    else {
      local_40 = (ulong)((uint)local_48 & 0x7fffffff);
      local_70 = 0;
      iVar11 = 0;
      do {
        uVar13 = (long)(int)local_70;
        while( true ) {
          local_74 = 0xffff;
          iVar9 = (int)uVar13;
          if (iVar10 <= iVar11) {
            *local_58 = U_BUFFER_OVERFLOW_ERROR;
            cVar15 = cVar2;
            goto LAB_002cd5d3;
          }
          local_70 = uVar13 + 1;
          local_64 = (uint)(ushort)local_38[uVar13];
          if (local_64 != 0x7e) break;
          lVar6 = 0;
          do {
            uVar7 = "~~"[lVar6];
            if (iVar11 < iVar10) {
              args->target[iVar11] = uVar7;
              if (args->offsets != (int32_t *)0x0) {
                *piVar14 = iVar9;
                piVar14 = piVar14 + 1;
              }
              iVar11 = iVar11 + 1;
            }
            else {
              pUVar1 = args->converter;
              cVar15 = pUVar1->charErrorBufferLength;
              pUVar1->charErrorBufferLength = cVar15 + '\x01';
              pUVar1->charErrorBuffer[cVar15] = uVar7;
              *local_58 = U_BUFFER_OVERFLOW_ERROR;
            }
            lVar6 = lVar6 + 1;
          } while ((int)lVar6 != 2);
          uVar13 = local_70;
          if ((long)local_40 <= (long)local_70) goto LAB_002cd262;
        }
        uVar5 = local_64;
        if (0x7f < local_64) {
          iVar4 = ucnv_MBCSFromUChar32_63
                            (*(UConverterSharedData **)(*local_50 + 0x30),local_64,&local_74,
                             args->converter->useFallback);
          uVar5 = 0xffff;
          if (((iVar4 == 2) && ((local_74 + 0x5e5f & 0xfffe) < 0x5c5e)) &&
             (uVar5 = local_74 - 0x8080, 0x5d < (local_74 + 0x5f & 0xfe))) {
            uVar5 = 0xffff;
          }
        }
        if (uVar5 == 0xffff) {
          UVar3 = U_INVALID_CHAR_FOUND;
          if (((local_64 & 0xf800) != 0xd800) ||
             (UVar3 = U_ILLEGAL_CHAR_FOUND, (local_64 >> 10 & 1) != 0)) goto LAB_002cd258;
          args->converter->fromUChar32 = local_64;
          goto LAB_002cd20d;
        }
        cVar15 = 0xff < uVar5;
        *(char *)((long)local_50 + 0x12) = cVar15;
        if (((int)cVar2 != (uint)(byte)cVar15) || ((char)local_50[2] == '\0')) {
          lVar6 = 0;
          if (uVar5 < 0x100) {
            do {
              uVar7 = "~}"[lVar6];
              if (iVar11 < iVar10) {
                args->target[iVar11] = uVar7;
                if (args->offsets != (int32_t *)0x0) {
                  *piVar14 = iVar9;
                  piVar14 = piVar14 + 1;
                }
                iVar11 = iVar11 + 1;
              }
              else {
                pUVar1 = args->converter;
                cVar2 = pUVar1->charErrorBufferLength;
                pUVar1->charErrorBufferLength = cVar2 + '\x01';
                pUVar1->charErrorBuffer[cVar2] = uVar7;
                *local_58 = U_BUFFER_OVERFLOW_ERROR;
              }
              lVar6 = lVar6 + 1;
            } while ((int)lVar6 != 2);
          }
          else {
            do {
              uVar7 = "~{"[lVar6];
              if (iVar11 < iVar10) {
                args->target[iVar11] = uVar7;
                if (args->offsets != (int32_t *)0x0) {
                  *piVar14 = iVar9;
                  piVar14 = piVar14 + 1;
                }
                iVar11 = iVar11 + 1;
              }
              else {
                pUVar1 = args->converter;
                cVar2 = pUVar1->charErrorBufferLength;
                pUVar1->charErrorBufferLength = cVar2 + '\x01';
                pUVar1->charErrorBuffer[cVar2] = uVar7;
                *local_58 = U_BUFFER_OVERFLOW_ERROR;
              }
              lVar6 = lVar6 + 1;
            } while ((int)lVar6 != 2);
          }
          *(undefined1 *)(local_50 + 2) = 1;
        }
        uVar7 = (uint8_t)uVar5;
        if (uVar5 < 0x100) {
          if (iVar10 <= iVar11) {
            pUVar1 = args->converter;
            cVar2 = pUVar1->charErrorBufferLength;
            pUVar1->charErrorBufferLength = cVar2 + '\x01';
            pUVar1->charErrorBuffer[cVar2] = uVar7;
            goto LAB_002cd54d;
          }
          iVar12 = iVar11 + 1;
          local_60[iVar11] = uVar7;
LAB_002cd570:
          iVar11 = iVar12;
          if (piVar14 == (int32_t *)0x0) {
            piVar14 = (int32_t *)0x0;
          }
          else {
            *piVar14 = iVar9;
            piVar14 = piVar14 + 1;
          }
        }
        else {
          uVar8 = (uint8_t)(uVar5 >> 8);
          if (iVar11 < iVar10) {
            local_60[iVar11] = uVar8;
            if (piVar14 == (int32_t *)0x0) {
              piVar14 = (int32_t *)0x0;
            }
            else {
              *piVar14 = iVar9;
              piVar14 = piVar14 + 1;
            }
            lVar6 = (long)iVar11 + 1;
            iVar12 = (int)lVar6;
            if (iVar12 < iVar10) {
              iVar12 = iVar11 + 2;
              local_60[lVar6] = uVar7;
              goto LAB_002cd570;
            }
            pUVar1 = args->converter;
            cVar2 = pUVar1->charErrorBufferLength;
            pUVar1->charErrorBufferLength = cVar2 + '\x01';
            pUVar1->charErrorBuffer[cVar2] = uVar7;
            *local_58 = U_BUFFER_OVERFLOW_ERROR;
            iVar11 = iVar12;
          }
          else {
            pUVar1 = args->converter;
            cVar2 = pUVar1->charErrorBufferLength;
            pUVar1->charErrorBufferLength = cVar2 + '\x01';
            pUVar1->charErrorBuffer[cVar2] = uVar8;
            pUVar1 = args->converter;
            cVar2 = pUVar1->charErrorBufferLength;
            pUVar1->charErrorBufferLength = cVar2 + '\x01';
            pUVar1->charErrorBuffer[cVar2] = uVar7;
LAB_002cd54d:
            *local_58 = U_BUFFER_OVERFLOW_ERROR;
          }
        }
        iVar9 = (int)local_70;
        cVar2 = cVar15;
      } while (iVar9 < (int)local_48);
    }
  }
  else {
    iVar11 = 0;
    local_70 = 0;
LAB_002cd20d:
    UVar3 = U_ZERO_ERROR;
    iVar10 = (int)local_70;
    if (iVar10 < (int)local_48) {
      UVar3 = U_ILLEGAL_CHAR_FOUND;
      if ((args->source[iVar10] & 0xfc00U) == 0xdc00) {
        local_70 = (ulong)(iVar10 + 1);
        local_64 = (uint)(ushort)args->source[iVar10] + args->converter->fromUChar32 * 0x400 +
                   0xfca02400;
        args->converter->fromUChar32 = 0;
        UVar3 = U_INVALID_CHAR_FOUND;
      }
    }
LAB_002cd258:
    *local_58 = UVar3;
    args->converter->fromUChar32 = local_64;
LAB_002cd262:
    iVar9 = (int)local_70;
    cVar15 = cVar2;
  }
LAB_002cd5d3:
  args->target = args->target + iVar11;
  args->source = args->source + iVar9;
  *(char *)((long)local_50 + 0x12) = cVar15;
  return;
}

Assistant:

static void  U_CALLCONV
UConverter_fromUnicode_HZ_OFFSETS_LOGIC (UConverterFromUnicodeArgs * args,
                                                      UErrorCode * err){
    const UChar *mySource = args->source;
    char *myTarget = args->target;
    int32_t* offsets = args->offsets;
    int32_t mySourceIndex = 0;
    int32_t myTargetIndex = 0;
    int32_t targetLength = (int32_t)(args->targetLimit - myTarget);
    int32_t mySourceLength = (int32_t)(args->sourceLimit - args->source);
    uint32_t targetUniChar = 0x0000;
    UChar32 mySourceChar = 0x0000;
    UConverterDataHZ *myConverterData=(UConverterDataHZ*)args->converter->extraInfo;
    UBool isTargetUCharDBCS = (UBool) myConverterData->isTargetUCharDBCS;
    UBool oldIsTargetUCharDBCS;
    int len =0;
    const char* escSeq=NULL;
    
    /* Calling code already handles this situation. */
    /*if ((args->converter == NULL) || (args->targetLimit < myTarget) || (args->sourceLimit < args->source)){
        *err = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }*/
    if(args->converter->fromUChar32!=0 && myTargetIndex < targetLength) {
        goto getTrail;
    }
    /*writing the char to the output stream */
    while (mySourceIndex < mySourceLength){
        targetUniChar = missingCharMarker;
        if (myTargetIndex < targetLength){
            
            mySourceChar = (UChar) mySource[mySourceIndex++];
            

            oldIsTargetUCharDBCS = isTargetUCharDBCS;
            if(mySourceChar ==UCNV_TILDE){
                /*concatEscape(args, &myTargetIndex, &targetLength,"\x7E\x7E",err,2,&mySourceIndex);*/
                len = ESC_LEN;
                escSeq = TILDE_ESCAPE;
                CONCAT_ESCAPE_MACRO(args, myTargetIndex, targetLength, escSeq,err,len,mySourceIndex);
                continue;
            } else if(mySourceChar <= 0x7f) {
                targetUniChar = mySourceChar;
            } else {
                int32_t length= ucnv_MBCSFromUChar32(myConverterData->gbConverter->sharedData,
                    mySourceChar,&targetUniChar,args->converter->useFallback);
                /* we can only use lead bytes 21..7D and trail bytes 21..7E */
                if( length == 2 &&
                    (uint16_t)(targetUniChar - 0xa1a1) <= (0xfdfe - 0xa1a1) &&
                    (uint8_t)(targetUniChar - 0xa1) <= (0xfe - 0xa1)
                ) {
                    targetUniChar -= 0x8080;
                } else {
                    targetUniChar = missingCharMarker;
                }
            }
            if (targetUniChar != missingCharMarker){
               myConverterData->isTargetUCharDBCS = isTargetUCharDBCS = (UBool)(targetUniChar>0x00FF);     
                 if(oldIsTargetUCharDBCS != isTargetUCharDBCS || !myConverterData->isEscapeAppended ){
                    /*Shifting from a double byte to single byte mode*/
                    if(!isTargetUCharDBCS){
                        len =ESC_LEN;
                        escSeq = SB_ESCAPE;
                        CONCAT_ESCAPE_MACRO(args, myTargetIndex, targetLength, escSeq,err,len,mySourceIndex);
                        myConverterData->isEscapeAppended = TRUE;
                    }
                    else{ /* Shifting from a single byte to double byte mode*/
                        len =ESC_LEN;
                        escSeq = DB_ESCAPE;
                        CONCAT_ESCAPE_MACRO(args, myTargetIndex, targetLength, escSeq,err,len,mySourceIndex);
                        myConverterData->isEscapeAppended = TRUE;
                        
                    }
                }
            
                if(isTargetUCharDBCS){
                    if( myTargetIndex <targetLength){
                        myTarget[myTargetIndex++] =(char) (targetUniChar >> 8);
                        if(offsets){
                            *(offsets++) = mySourceIndex-1;
                        }
                        if(myTargetIndex < targetLength){
                            myTarget[myTargetIndex++] =(char) targetUniChar;
                            if(offsets){
                                *(offsets++) = mySourceIndex-1;
                            }
                        }else{
                            args->converter->charErrorBuffer[args->converter->charErrorBufferLength++] = (char) targetUniChar;
                            *err = U_BUFFER_OVERFLOW_ERROR;
                        } 
                    }else{
                        args->converter->charErrorBuffer[args->converter->charErrorBufferLength++] =(char) (targetUniChar >> 8);
                        args->converter->charErrorBuffer[args->converter->charErrorBufferLength++] = (char) targetUniChar;
                        *err = U_BUFFER_OVERFLOW_ERROR;
                    }

                }else{
                    if( myTargetIndex <targetLength){
                        myTarget[myTargetIndex++] = (char) (targetUniChar );
                        if(offsets){
                            *(offsets++) = mySourceIndex-1;
                        }
                        
                    }else{
                        args->converter->charErrorBuffer[args->converter->charErrorBufferLength++] = (char) targetUniChar;
                        *err = U_BUFFER_OVERFLOW_ERROR;
                    }
                }

            }
            else{
                /* oops.. the code point is unassigned */
                /*Handle surrogates */
                /*check if the char is a First surrogate*/
                if(U16_IS_SURROGATE(mySourceChar)) {
                    if(U16_IS_SURROGATE_LEAD(mySourceChar)) {
                        args->converter->fromUChar32=mySourceChar;
getTrail:
                        /*look ahead to find the trail surrogate*/
                        if(mySourceIndex <  mySourceLength) {
                            /* test the following code unit */
                            UChar trail=(UChar) args->source[mySourceIndex];
                            if(U16_IS_TRAIL(trail)) {
                                ++mySourceIndex;
                                mySourceChar=U16_GET_SUPPLEMENTARY(args->converter->fromUChar32, trail);
                                args->converter->fromUChar32=0x00;
                                /* there are no surrogates in GB2312*/
                                *err = U_INVALID_CHAR_FOUND;
                                /* exit this condition tree */
                            } else {
                                /* this is an unmatched lead code unit (1st surrogate) */
                                /* callback(illegal) */
                                *err=U_ILLEGAL_CHAR_FOUND;
                            }
                        } else {
                            /* no more input */
                            *err = U_ZERO_ERROR;
                        }
                    } else {
                        /* this is an unmatched trail code unit (2nd surrogate) */
                        /* callback(illegal) */
                        *err=U_ILLEGAL_CHAR_FOUND;
                    }
                } else {
                    /* callback(unassigned) for a BMP code point */
                    *err = U_INVALID_CHAR_FOUND;
                }

                args->converter->fromUChar32=mySourceChar;
                break;
            }
        }
        else{
            *err = U_BUFFER_OVERFLOW_ERROR;
            break;
        }
        targetUniChar=missingCharMarker;
    }

    args->target += myTargetIndex;
    args->source += mySourceIndex;
    myConverterData->isTargetUCharDBCS = isTargetUCharDBCS;
}